

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

void __thiscall
ncnn::InnerProduct_x86_avx512::InnerProduct_x86_avx512(InnerProduct_x86_avx512 *this)

{
  undefined8 *in_RDI;
  InnerProduct *in_stack_ffffffffffffffd8;
  
  InnerProduct::InnerProduct(in_stack_ffffffffffffffd8);
  *in_RDI = &PTR__InnerProduct_x86_avx512_02014508;
  in_RDI[0x4b] = 0;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  *(undefined4 *)(in_RDI + 0x4e) = 0;
  in_RDI[0x4f] = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)((long)in_RDI + 0x284) = 0;
  *(undefined4 *)(in_RDI + 0x51) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 0;
  *(undefined4 *)(in_RDI + 0x52) = 0;
  in_RDI[0x53] = 0;
  in_RDI[0x54] = 0;
  in_RDI[0x55] = 0;
  in_RDI[0x56] = 0;
  *(undefined4 *)(in_RDI + 0x57) = 0;
  in_RDI[0x58] = 0;
  *(undefined4 *)(in_RDI + 0x59) = 0;
  *(undefined4 *)((long)in_RDI + 0x2cc) = 0;
  *(undefined4 *)(in_RDI + 0x5a) = 0;
  *(undefined4 *)((long)in_RDI + 0x2d4) = 0;
  *(undefined4 *)(in_RDI + 0x5b) = 0;
  in_RDI[0x5c] = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  in_RDI[0x4a] = 0;
  return;
}

Assistant:

InnerProduct_x86_avx512::InnerProduct_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    flatten = 0;
}